

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O1

int send_twin_operation_request
              (TWIN_MESSENGER_INSTANCE_conflict *twin_msgr,TWIN_OPERATION_CONTEXT *op_ctx,
              CONSTBUFFER_HANDLE data)

{
  TWIN_OPERATION_TYPE TVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  MESSAGE_HANDLE message;
  AMQP_VALUE map;
  time_t tVar5;
  LOGGER_LOG p_Var6;
  char *pcVar7;
  AMQP_VALUE annotations;
  CONSTBUFFER *pCVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  uchar *puVar12;
  char *pcVar13;
  BINARY_DATA amqp_data;
  
  TVar1 = op_ctx->type;
  pcVar10 = op_ctx->correlation_id;
  switch(TVar1) {
  case TWIN_OPERATION_TYPE_PATCH:
    pcVar9 = "PATCH";
    break;
  case TWIN_OPERATION_TYPE_GET:
  case TWIN_OPERATION_TYPE_GET_ON_DEMAND:
    pcVar9 = "GET";
    break;
  case TWIN_OPERATION_TYPE_PUT:
    pcVar9 = "PUT";
    break;
  case TWIN_OPERATION_TYPE_DELETE:
    pcVar9 = "DELETE";
    break;
  default:
    p_Var6 = xlogging_get_log_function();
    bVar2 = true;
    if (p_Var6 == (LOGGER_LOG)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      if (TVar1 < (TWIN_OPERATION_TYPE_PUT|TWIN_OPERATION_TYPE_GET)) {
        pcVar7 = TWIN_OPERATION_TYPEStringStorage[TVar1];
      }
      else {
        pcVar7 = "NULL";
      }
      pcVar9 = (char *)0x0;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"get_twin_operation_name",0x2ce,1,"Unrecognized TWIN operation (%s)",pcVar7);
    }
    goto LAB_0013a7b0;
  }
  bVar2 = false;
LAB_0013a7b0:
  if (bVar2) {
LAB_0013a7b5:
    message = (MESSAGE_HANDLE)0x0;
  }
  else {
    message = message_create();
    if (message == (MESSAGE_HANDLE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0013a7b5;
      message = (MESSAGE_HANDLE)0x0;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"create_amqp_message_for_twin_operation",0x2ee,1,
                "Failed creating AMQP message (%s)",pcVar9);
    }
    else {
      map = amqpvalue_create_map();
      if (map == (AMQP_VALUE)0x0) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"create_amqp_message_for_twin_operation",0x2f6,1,
                    "Failed creating map for message annotations");
        }
        message_destroy(message);
        goto LAB_0013a7b5;
      }
      iVar3 = add_map_item(map,"operation",pcVar9);
      if (iVar3 == 0) {
        if ((TVar1 == TWIN_OPERATION_TYPE_PATCH) &&
           (iVar3 = add_map_item(map,"resource","/properties/reported"), iVar3 != 0)) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed adding resource to AMQP message annotations (%s)";
            iVar3 = 0x305;
            goto LAB_0013a824;
          }
          goto LAB_0013a82f;
        }
        if (((TVar1 & ~TWIN_OPERATION_TYPE_PATCH) == TWIN_OPERATION_TYPE_PUT) &&
           (iVar3 = add_map_item(map,"resource","/notifications/twin/properties/desired"),
           iVar3 != 0)) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed adding resource to AMQP message annotations (%s)";
            iVar3 = 0x30c;
            goto LAB_0013a824;
          }
          goto LAB_0013a82f;
        }
        annotations = amqpvalue_create_message_annotations(map);
        if (annotations == (AMQP_VALUE)0x0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"add_amqp_message_annotation",0x13d,1,
                      "Failed creating new AMQP message annotations");
          }
LAB_0013ac56:
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed adding annotations to AMQP message (%s)";
            iVar3 = 0x312;
            goto LAB_0013a824;
          }
          goto LAB_0013a82f;
        }
        iVar3 = message_set_message_annotations(message,annotations);
        if (iVar3 != 0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"add_amqp_message_annotation",0x144,1,
                      "Failed setting AMQP message annotations");
          }
          amqpvalue_destroy(annotations);
          goto LAB_0013ac56;
        }
        amqpvalue_destroy(annotations);
        iVar3 = set_message_correlation_id(message,pcVar10);
        if (iVar3 != 0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed AMQP message correlation-id (%s)";
            iVar3 = 0x318;
            goto LAB_0013a824;
          }
          goto LAB_0013a82f;
        }
        if (data == (CONSTBUFFER_HANDLE)0x0) {
          sVar11 = 1;
          puVar12 = " ";
        }
        else {
          pCVar8 = CONSTBUFFER_GetContent(data);
          puVar12 = pCVar8->buffer;
          sVar11 = pCVar8->size;
        }
        amqp_data.length = sVar11;
        amqp_data.bytes = puVar12;
        iVar3 = message_add_body_amqp_data(message,amqp_data);
        if (iVar3 != 0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed adding twin patch data to AMQP message body";
            iVar3 = 0x32f;
            goto LAB_0013a824;
          }
          goto LAB_0013a82f;
        }
      }
      else {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0013a82f;
        pcVar10 = "Failed adding operation to AMQP message annotations (%s)";
        iVar3 = 0x2fe;
LAB_0013a824:
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"create_amqp_message_for_twin_operation",iVar3,1,pcVar10);
LAB_0013a82f:
        message_destroy(message);
        message = (MESSAGE_HANDLE)0x0;
      }
      amqpvalue_destroy(map);
    }
  }
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return 0x3be;
    }
    if ((ulong)op_ctx->type < 6) {
      pcVar10 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
    }
    else {
      pcVar10 = "NULL";
    }
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"send_twin_operation_request",0x3bd,1,"Failed creating request message (%s, %s, %s)",
              twin_msgr->device_id,pcVar10,op_ctx->correlation_id);
    return 0x3be;
  }
  iVar3 = 0;
  tVar5 = get_time((time_t *)0x0);
  op_ctx->time_sent = tVar5;
  if (tVar5 == -1) {
    p_Var6 = xlogging_get_log_function();
    iVar3 = 0x3c5;
    if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0013ab03;
    pcVar10 = twin_msgr->device_id;
    if ((ulong)op_ctx->type < 6) {
      pcVar9 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
    }
    else {
      pcVar9 = "NULL";
    }
    pcVar7 = op_ctx->correlation_id;
    pcVar13 = "Failed setting TWIN operation sent time (%s, %s, %s)";
    iVar4 = 0x3c4;
  }
  else {
    iVar4 = amqp_messenger_send_async
                      (twin_msgr->amqp_msgr,message,on_amqp_send_complete_callback,op_ctx);
    if (iVar4 == 0) goto LAB_0013ab03;
    p_Var6 = xlogging_get_log_function();
    iVar3 = 0x3ca;
    if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0013ab03;
    pcVar10 = twin_msgr->device_id;
    if ((ulong)op_ctx->type < 6) {
      pcVar9 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
    }
    else {
      pcVar9 = "NULL";
    }
    pcVar7 = op_ctx->correlation_id;
    pcVar13 = "Failed sending request message for (%s, %s, %s)";
    iVar4 = 0x3c9;
  }
  (*p_Var6)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,"send_twin_operation_request",iVar4,1,pcVar13,pcVar10,pcVar9,pcVar7);
LAB_0013ab03:
  message_destroy(message);
  return iVar3;
}

Assistant:

static int send_twin_operation_request(TWIN_MESSENGER_INSTANCE* twin_msgr, TWIN_OPERATION_CONTEXT* op_ctx, CONSTBUFFER_HANDLE data)
{
    int result;
    MESSAGE_HANDLE amqp_message;

    if ((amqp_message = create_amqp_message_for_twin_operation(op_ctx->type, op_ctx->correlation_id, data)) == NULL)
    {
        LogError("Failed creating request message (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
        result = MU_FAILURE;
    }
    else
    {
        if ((op_ctx->time_sent = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Failed setting TWIN operation sent time (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else if (amqp_messenger_send_async(twin_msgr->amqp_msgr, amqp_message, on_amqp_send_complete_callback, (void*)op_ctx) != 0)
        {
            LogError("Failed sending request message for (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }

        message_destroy(amqp_message);
    }

    return result;
}